

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

void Gia_ManInsertOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew)

{
  Abc_NtkFunc_t AVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  long lVar8;
  
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    __assert_fail("!Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x1fa,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x1fb,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,iVar7);
    if (((pAVar3->field_6).pCopy != (Abc_Obj_t *)0x0) && (((pAVar3->field_6).pCopy)->pNtk != pNew))
    {
      __assert_fail("!pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                    ,0x1fe,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar7);
    for (lVar8 = 0; lVar8 < (pAVar3->vFanouts).nSize; lVar8 = lVar8 + 1) {
      pvVar2 = pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanouts).pArray[lVar8]];
      pAVar4 = Abc_ObjModel(pAVar3);
      pAVar5 = Abc_NtkPo(pAVar4,(int)lVar8);
      pAVar5 = (pAVar5->field_6).pCopy;
      *(Abc_Obj_t **)((long)pvVar2 + 0x40) = pAVar5;
      if ((pAVar5 != (Abc_Obj_t *)0x0) && (pAVar5->pNtk != pNew)) {
        __assert_fail("!pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                      ,0x204,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      Abc_NtkDeleteObj(pAVar3);
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar7);
    for (lVar8 = 0; lVar8 < (pAVar3->vFanins).nSize; lVar8 = lVar8 + 1) {
      pAVar5 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar8]];
      if ((pAVar5->vFanins).nSize == 0) {
        pAVar4 = Abc_ObjModel(pAVar3);
        pAVar6 = Abc_NtkPi(pAVar4,(int)lVar8);
        pAVar6 = Gia_ManInsertOne_rec(pNtk,pNew,(pAVar6->field_6).pCopy);
        Abc_ObjAddFanin(pAVar5,pAVar6);
      }
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 1) {
    pAVar3 = Abc_NtkPo(pNtk,iVar7);
    if ((pAVar3->vFanins).nSize == 0) {
      pAVar5 = Gia_ManInsertOne_rec(pNtk,pNew,(pAVar3->field_6).pCopy);
      Abc_ObjAddFanin(pAVar3,pAVar5);
    }
  }
  pNtk->pManFunc = pNew->pManFunc;
  AVar1 = pNew->ntkFunc;
  pNtk->ntkFunc = AVar1;
  if (AVar1 == ABC_FUNC_MAP) {
    return;
  }
  __assert_fail("Abc_NtkHasMapping(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x215,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Gia_ManInsertOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pBox;  int i, k;
    assert( !Abc_NtkHasMapping(pNtk) );
    assert( Abc_NtkHasMapping(pNew) );
    // check that PIs point to barbufs
    Abc_NtkForEachPi( pNtk, pObj, i )
        assert( !pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew );
    // make barbufs point to box outputs
    Abc_NtkForEachBox( pNtk, pBox, i )
        Abc_ObjForEachFanout( pBox, pObj, k )
        {
            pObj->pCopy = Abc_NtkPo(Abc_ObjModel(pBox), k)->pCopy;
            assert( !pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew );
        }
    // remove internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_NtkDeleteObj( pObj );
    // start traversal from box inputs
    Abc_NtkForEachBox( pNtk, pBox, i )
        Abc_ObjForEachFanin( pBox, pObj, k )
            if ( Abc_ObjFaninNum(pObj) == 0 )
                Abc_ObjAddFanin( pObj, Gia_ManInsertOne_rec(pNtk, pNew, Abc_NtkPi(Abc_ObjModel(pBox), k)->pCopy) );
    // start traversal from primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        if ( Abc_ObjFaninNum(pObj) == 0 )
            Abc_ObjAddFanin( pObj, Gia_ManInsertOne_rec(pNtk, pNew, pObj->pCopy) );
    // update the functionality manager
    pNtk->pManFunc = pNew->pManFunc;
    pNtk->ntkFunc  = pNew->ntkFunc;
    assert( Abc_NtkHasMapping(pNtk) );
}